

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O1

int main(void)

{
  has_then_execute_free_function local_a;
  has_then_execute_member local_9;
  
  test_then_execute<has_then_execute_member>(&local_9);
  test_then_execute<has_then_execute_free_function>(&local_a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  static_assert(std::experimental::execution::has_then_execute_member<has_then_execute_member>::value, "member then_execute() is not detected."); 
  static_assert(!std::experimental::execution::has_execute_free_function<has_then_execute_member>::value, "free function then_execute() is detected."); 

  static_assert(!std::experimental::execution::has_then_execute_member<has_then_execute_free_function>::value, "member then_execute() is detected."); 
  static_assert(std::experimental::execution::has_then_execute_free_function<has_then_execute_free_function>::value, "free function then_execute() is not detected."); 

  test_then_execute(has_then_execute_member());
  test_then_execute(has_then_execute_free_function());

  std::cout << "OK" << std::endl;
}